

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O0

void __thiscall Assimp::ASE::Mesh::Mesh(Mesh *this,string *name)

{
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_38;
  uint local_28;
  uint c;
  string *name_local;
  Mesh *this_local;
  
  MeshWithSmoothingGroups<Assimp::ASE::Face>::MeshWithSmoothingGroups
            (&this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>);
  BaseNode::BaseNode(&this->super_BaseNode,Mesh,name);
  local_38 = this->amTexCoords;
  do {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(local_38);
    local_38 = local_38 + 1;
  } while ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_38 !=
           &this->mVertexColors);
  memset(&this->mVertexColors,0,0x18);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector(&this->mVertexColors);
  memset(&this->mBoneVertices,0,0x18);
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::vector
            (&this->mBoneVertices);
  memset(&this->mBones,0,0x18);
  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::vector(&this->mBones);
  this->iMaterialIndex = 0xffffffff;
  this->bSkip = false;
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    this->mNumUVComponents[local_28] = 2;
  }
  return;
}

Assistant:

explicit Mesh(const std::string &name)
    : BaseNode( BaseNode::Mesh, name )
    , mVertexColors()
    , mBoneVertices()
    , mBones()
    , iMaterialIndex(Face::DEFAULT_MATINDEX)
    , bSkip     (false) {
        for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
            this->mNumUVComponents[c] = 2;
        }
    }